

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void __thiscall
jessilib::format_not_available::format_not_available(format_not_available *this,string *in_format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *in_format_local;
  format_not_available *this_local;
  
  local_18 = in_format;
  in_format_local = (string *)this;
  std::operator+(&local_58,"Format \"",in_format);
  std::operator+(&local_38,&local_58,"\"not recognized");
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__format_not_available_00310f90;
  return;
}

Assistant:

format_not_available::format_not_available(const std::string& in_format)
	: std::runtime_error{ "Format \"" + in_format + "\"not recognized" } {
	// Empty ctor body
}